

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O0

void __thiscall bandit::reporter::xunit::it_starting(xunit *this,string *desc)

{
  ostream *poVar1;
  rep rVar2;
  string local_88;
  string local_58;
  string local_38;
  string *local_18;
  string *desc_local;
  xunit *this_local;
  
  local_18 = desc;
  desc_local = (string *)this;
  progress_base::it_starting(&this->super_progress_base,desc);
  poVar1 = std::operator<<((ostream *)&this->field_0x80,"\t<testcase classname=\"");
  progress_base::current_context_name_abi_cxx11_(&local_58,&this->super_progress_base);
  escape(&local_38,this,&local_58);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::operator<<(poVar1,"\" ");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  poVar1 = std::operator<<((ostream *)&this->field_0x80,"name=\"");
  escape(&local_88,this,local_18);
  poVar1 = std::operator<<(poVar1,(string *)&local_88);
  std::operator<<(poVar1,"\"");
  std::__cxx11::string::~string((string *)&local_88);
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->testcase_start_time_point_).__d.__r = rVar2;
  return;
}

Assistant:

void it_starting(const std::string& desc) override {
        progress_base::it_starting(desc);
        work_stm_ << "\t<testcase classname=\"" << escape(current_context_name()) << "\" ";
        work_stm_ << "name=\"" << escape(desc) << "\"";
        testcase_start_time_point_ = std::chrono::high_resolution_clock::now();
      }